

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O0

FString __thiscall FluidSynthMIDIDevice::GetStats(FluidSynthMIDIDevice *this)

{
  _func_int_fluid_synth_t_ptr *p_Var1;
  _func_double_fluid_synth_t_ptr *p_Var2;
  _func_int_fluid_settings_t_ptr_char_ptr_char_ptr_ptr *p_Var3;
  _func_int_fluid_settings_t_ptr_char_ptr_int_ptr *p_Var4;
  long in_RSI;
  uint local_54;
  char *pcStack_50;
  int maxpoly;
  char *reverb;
  char *chorus;
  double load;
  uint local_30;
  int voices;
  int polyphony;
  undefined1 local_19;
  FluidSynthMIDIDevice *this_local;
  FString *out;
  
  this_local = this;
  if ((*(long *)(in_RSI + 0x68) == 0) || (*(long *)(in_RSI + 0x60) == 0)) {
    FString::FString((FString *)this,"FluidSynth is invalid");
  }
  else {
    local_19 = 0;
    FString::FString((FString *)this);
    FCriticalSection::Enter((FCriticalSection *)(in_RSI + 8));
    p_Var1 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_get_polyphony);
    local_30 = (*p_Var1)(*(fluid_synth_t **)(in_RSI + 0x68));
    p_Var1 = ::TReqProc::operator_cast_to_function_pointer
                       ((TReqProc *)&fluid_synth_get_active_voice_count);
    load._4_4_ = (*p_Var1)(*(fluid_synth_t **)(in_RSI + 0x68));
    p_Var2 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_get_cpu_load);
    chorus = (char *)(*p_Var2)(*(fluid_synth_t **)(in_RSI + 0x68));
    p_Var3 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_getstr);
    (*p_Var3)(*(fluid_settings_t **)(in_RSI + 0x60),"synth.chorus.active",&reverb);
    p_Var3 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_getstr);
    (*p_Var3)(*(fluid_settings_t **)(in_RSI + 0x60),"synth.reverb.active",&stack0xffffffffffffffb0);
    p_Var4 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_getint);
    (*p_Var4)(*(fluid_settings_t **)(in_RSI + 0x60),"synth.polyphony",(int *)&local_54);
    FCriticalSection::Leave((FCriticalSection *)(in_RSI + 8));
    FString::Format((FString *)this,
                    "Voices: \x1cK%3d\x1c-/\x1cI%3d\x1c-(\x1cG%3d\x1c-)\x1cK%6.2f\x1c-%% CPU   Reverb: \x1cK%3s\x1c- Chorus: \x1cK%3s"
                    ,chorus,(ulong)load._4_4_,(ulong)local_30,(ulong)local_54,pcStack_50,reverb);
  }
  return (FString)(char *)this;
}

Assistant:

FString FluidSynthMIDIDevice::GetStats()
{
	if (FluidSynth == NULL || FluidSettings == NULL)
	{
		return "FluidSynth is invalid";
	}
	FString out;

	CritSec.Enter();
	int polyphony = fluid_synth_get_polyphony(FluidSynth);
	int voices = fluid_synth_get_active_voice_count(FluidSynth);
	double load = fluid_synth_get_cpu_load(FluidSynth);
	char *chorus, *reverb;
	int maxpoly;
	fluid_settings_getstr(FluidSettings, "synth.chorus.active", &chorus);
	fluid_settings_getstr(FluidSettings, "synth.reverb.active", &reverb);
	fluid_settings_getint(FluidSettings, "synth.polyphony", &maxpoly);
	CritSec.Leave();

	out.Format("Voices: " TEXTCOLOR_YELLOW "%3d" TEXTCOLOR_NORMAL "/" TEXTCOLOR_ORANGE "%3d" TEXTCOLOR_NORMAL "(" TEXTCOLOR_RED "%3d" TEXTCOLOR_NORMAL ")"
			   TEXTCOLOR_YELLOW "%6.2f" TEXTCOLOR_NORMAL "%% CPU   "
			   "Reverb: " TEXTCOLOR_YELLOW "%3s" TEXTCOLOR_NORMAL
			   " Chorus: " TEXTCOLOR_YELLOW "%3s",
		voices, polyphony, maxpoly, load, reverb, chorus);
	return out;
}